

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_AddVar_Test::TestBody(ProblemTest_AddVar_Test *this)

{
  Type TVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar2;
  int iVar3;
  char *pcVar4;
  MutVariable MVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  AssertHelper local_3b0;
  AssertionResult gtest_ar_2;
  Variable cvar;
  AssertionResult gtest_ar;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)
       ((ulong)cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_._4_4_ << 0x20);
  gtest_ar_2._0_4_ =
       SUB84((ulong)((long)p.vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)p.vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","p.num_vars()",(int *)&cvar,(int *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&cvar);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               100,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&cvar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&cvar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&p,1.1,2.2,CONTINUOUS);
  cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)
       CONCAT44(cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                problem_._4_4_,1);
  gtest_ar_2._0_4_ =
       SUB84((ulong)((long)p.vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)p.vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","p.num_vars()",(int *)&cvar,(int *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&cvar);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x66,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&cvar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&cvar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  MVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar5.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar5.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_3b8.ptr_._4_4_ << 0x20);
  cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ =
       gtest_ar.message_.ptr_._4_4_;
  local_3b0.data_._0_4_ =
       cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  gtest_ar._0_8_ =
       cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  gtest_ar.message_.ptr_._0_4_ =
       cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"0","cvar.index()",(int *)&local_3b8,(int *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x69,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_3b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff199999999999a
  ;
  local_3b0.data_ =
       (AssertHelperData *)
       ((cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
        )->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start
       [cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
       lb;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,"1.1","cvar.lb()",(double *)&local_3b8,(double *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_3b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400199999999999a
  ;
  local_3b0.data_ =
       (AssertHelperData *)
       ((cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
        )->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start
       [cvar.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
       ub;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,"2.2","cvar.ub()",(double *)&local_3b8,(double *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_3b8.ptr_ = local_3b8.ptr_ & 0xffffffff00000000;
  TVar1 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type(&cvar);
  local_3b0.data_._0_4_ = TVar1;
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&gtest_ar_2,"mp::var::CONTINUOUS","cvar.type()",(Type *)&local_3b8,
             (Type *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&p,3.3,4.4,INTEGER);
  local_3b8.ptr_._0_4_ = 2;
  local_3b0.data_._0_4_ =
       (int)((ulong)((long)p.vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)p.vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"2","p.num_vars()",(int *)&local_3b8,(int *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x6e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  MVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,1);
  pBVar2 = MVar5.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar3 = MVar5.
          super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3b8.ptr_._0_4_ = 1;
  local_3b0.data_._0_4_ = iVar3;
  gtest_ar._0_8_ = pBVar2;
  gtest_ar.message_.ptr_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"1","var.index()",(int *)&local_3b8,(int *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x70,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_3b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400a666666666666
  ;
  local_3b0.data_ =
       (AssertHelperData *)
       (pBVar2->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar3].lb;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,"3.3","var.lb()",(double *)&local_3b8,(double *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x71,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_3b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x401199999999999a
  ;
  local_3b0.data_ =
       (AssertHelperData *)
       (pBVar2->vars_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar3].ub;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,"4.4","var.ub()",(double *)&local_3b8,(double *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x72,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_3b8.ptr_._0_4_ = 1;
  TVar1 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)&gtest_ar);
  local_3b0.data_._0_4_ = TVar1;
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&gtest_ar_2,"mp::var::INTEGER","var.type()",(Type *)&local_3b8,
             (Type *)&local_3b0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x73,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, AddVar) {
  Problem p;
  EXPECT_EQ(0, p.num_vars());
  p.AddVar(1.1, 2.2);
  EXPECT_EQ(1, p.num_vars());
  Problem::Variable var = p.var(0);
  const Problem::Variable cvar = var;
  EXPECT_EQ(0, cvar.index());
  EXPECT_EQ(1.1, cvar.lb());
  EXPECT_EQ(2.2, cvar.ub());
  EXPECT_EQ(mp::var::CONTINUOUS, cvar.type());
  p.AddVar(3.3, 4.4, mp::var::INTEGER);
  EXPECT_EQ(2, p.num_vars());
  var = p.var(1);
  EXPECT_EQ(1, var.index());
  EXPECT_EQ(3.3, var.lb());
  EXPECT_EQ(4.4, var.ub());
  EXPECT_EQ(mp::var::INTEGER, var.type());
}